

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldscript.c
# Opt level: O3

Phdr ** endofsecdef(GlobalVars *gv,LinkedSection *ls)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  char cVar4;
  int iVar5;
  uint uVar6;
  Phdr **__ptr;
  char *__s2;
  Phdr *pPVar7;
  char *pcVar8;
  MemoryDescr **ppMVar9;
  lword val;
  int local_4c;
  uint16_t local_38 [4];
  
  __ptr = (Phdr **)alloc(0x200);
  endofblock('{','}');
  bVar2 = false;
  local_4c = 0;
LAB_00112e5a:
  do {
    cVar3 = getchr();
    switch(cVar3) {
    case ':':
      __s2 = getarg('\x01');
      pcVar8 = scriptname;
      if (__s2 == (char *)0x0) {
        uVar6 = getlineno();
        error(0x4e,pcVar8,(ulong)uVar6);
      }
      else {
        pPVar7 = find_phdr((GlobalVars *)gv->phdrlist,__s2,(MemoryDescr *)0x0,(MemoryDescr *)0x0);
        pcVar8 = scriptname;
        if (pPVar7 == (Phdr *)0x0) {
          uVar6 = getlineno();
          iVar5 = 0x6f;
LAB_00112fee:
          error(iVar5,pcVar8,(ulong)uVar6,__s2);
          bVar2 = true;
        }
        else {
          iVar5 = local_4c + 1;
          __ptr[local_4c] = pPVar7;
          bVar1 = 0x3e < local_4c;
          local_4c = iVar5;
          if (bVar1) {
            ierror("%sphdrcnt overrun","endofsecdef(): ");
          }
        }
      }
      break;
    case ';':
    case '<':
    case '?':
      iVar5 = 1;
LAB_00113098:
      back(iVar5);
LAB_0011309d:
      if (bVar2) {
        free(__ptr);
        __ptr = (Phdr **)0x0;
      }
      else {
        __ptr[local_4c] = (Phdr *)0x0;
      }
      return __ptr;
    case '=':
      iVar5 = parse_expr(-1,(lword *)local_38);
      pcVar8 = scriptname;
      if (iVar5 == 0) {
        uVar6 = getlineno();
        iVar5 = 0x43;
        goto LAB_0011302a;
      }
      gv->filldata = local_38[0];
      break;
    case 'A':
      cVar4 = getchr();
      if (cVar4 != 'T') {
        iVar5 = 2;
        goto LAB_00113098;
      }
      cVar4 = getchr();
      if (cVar4 != '>') {
        back(1);
        pcVar8 = scriptname;
        uVar6 = getlineno();
        error(0x42,pcVar8,(ulong)uVar6,0x3e);
      }
    case '>':
    case '@':
      __s2 = getarg('\x01');
      pcVar8 = scriptname;
      if (__s2 == (char *)0x0) {
        uVar6 = getlineno();
        iVar5 = 0x4e;
LAB_0011302a:
        error(iVar5,pcVar8,(ulong)uVar6);
        bVar2 = true;
      }
      else {
        ppMVar9 = &memory_blocks;
        do {
          pcVar8 = scriptname;
          ppMVar9 = &((MemoryDescr *)ppMVar9)->next->next;
          if ((MemoryDescr *)ppMVar9 == (MemoryDescr *)0x0) {
            uVar6 = getlineno();
            iVar5 = 0x46;
            goto LAB_00112fee;
          }
          iVar5 = strcmp(((MemoryDescr *)ppMVar9)->name,__s2);
        } while (iVar5 != 0);
        if (cVar3 != '>') goto LAB_00113000;
        if ((ls != (LinkedSection *)0x0) &&
           (ls->relocmem = (MemoryDescr *)ppMVar9, vdefmem = (MemoryDescr *)ppMVar9,
           ls->destmem == (MemoryDescr *)0x0)) goto LAB_00113009;
      }
      break;
    default:
      iVar5 = 1;
      if (cVar3 == '\0') goto LAB_0011309d;
      goto LAB_00113098;
    }
  } while( true );
LAB_00113000:
  if (ls != (LinkedSection *)0x0) {
LAB_00113009:
    ls->destmem = (MemoryDescr *)ppMVar9;
    ldefmem = (MemoryDescr *)ppMVar9;
  }
  goto LAB_00112e5a;
}

Assistant:

static struct Phdr **endofsecdef(struct GlobalVars *gv,
                                 struct LinkedSection *ls)
/* Parses syntax of everything which follows the '}' of a section
   definition. Memory-region pointers and fill-value will be initialized
   when the section-pointer 'ls' is given.
   On success the function returns a list of pointers to Phdr structures
   which were defined (terminated by a NULL pointer). This list must
   be deallocated by the caller!
   Syntax: } [>memregion] [AT>lma-region] [:phdr ...] [=fill] */
{
  const char *fn = "endofsecdef(): ";
  struct Phdr **pp = alloc(64 * sizeof(struct Phdr *));  /* it's ugly! */
  struct Phdr *phdr;
  struct MemoryDescr *md;
  int phdrcnt=0,done=0,err=0;
  char c,*buf;
  lword val;

  endofblock('{','}');

  while (!done) {
    switch (c = getchr()) {
      case '>':
      case '@':
      case 'A':
        if (c == 'A') {
          if (getchr() == 'T') {
            if (getchr() != '>') {
              back(1);
              error(66,scriptname,getlineno(),'>');  /* '>' expected */
            }
          }
          else {
            /* it's not AT, but maybe an ASSERT keyword, so get out */
            back(2);
            done = 1;
            break;
          }
        }
        if (buf = getword()) {
          if (md = find_memblock(buf)) {
            if (c == '>') {
              if (ls) {
                ls->relocmem = md;
                vdefmem = md;
                if (ls->destmem == NULL) {
                  ls->destmem = md;
                  ldefmem = md;
                }
              }
            }
            else if (ls) {
              ls->destmem = md;
              ldefmem = md;
            }
          }
          else {
            error(70,scriptname,getlineno(),buf);  /* Unknown memory region */
            err = 1;
          }
        }
        else {
          error(78,scriptname,getlineno());   /* missing argument */
          err = 1;
        }
        break;

      case ':':
        if (buf = getword()) {
          if (phdr = find_phdr(gv,buf,NULL,NULL)) {
            pp[phdrcnt++] = phdr;
            if (phdrcnt >= 64)
              ierror("%sphdrcnt overrun",fn);
          }
          else {
            error(111,scriptname,getlineno(),buf);  /* unknown PHDR */
            err = 1;
          }
        }
        else
          error(78,scriptname,getlineno());
        break;

      case '=':
        if (parse_expr(-1,&val)) {
          gv->filldata = (uint16_t)(val & 0xffff);
        }
        else {
          error(67,scriptname,getlineno());  /* Absolute number expected */
          err = 1;
        }
        break;

      case '\0':
        done = 1;
        break;

      default:
        done = 1;
        back(1);
        break;
    }
  }

  if (err) {
    free(pp);
    pp = NULL;
  }
  else
    pp[phdrcnt] = NULL;

  return pp;
}